

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O2

CURLcode Curl_dynhds_add_custom(Curl_easy *data,_Bool is_connect,dynhds *hds)

{
  char cVar1;
  connectdata *pcVar2;
  curl_slist *pcVar3;
  char *__s;
  _Bool _Var4;
  uchar uVar5;
  CURLcode CVar6;
  char *pcVar7;
  size_t valuelen;
  long lVar8;
  curl_slist **ppcVar9;
  undefined7 in_register_00000031;
  size_t n1len;
  long local_60;
  curl_slist *h [2];
  
  pcVar2 = data->conn;
  local_60 = 1;
  if ((int)CONCAT71(in_register_00000031,is_connect) == 0) {
    h[0] = (data->set).headers;
    if ((((ulong)pcVar2->bits & 9) == 1) && (((data->set).field_0x8ca & 8) != 0)) {
      h[1] = (data->set).proxyheaders;
      local_60 = 2;
    }
  }
  else {
    if (((data->set).field_0x8ca & 8) == 0) {
      h[0] = (data->set).headers;
    }
    else {
      h[0] = (data->set).proxyheaders;
    }
  }
  lVar8 = 0;
  do {
    if (lVar8 == local_60) {
      return CURLE_OK;
    }
    ppcVar9 = h + lVar8;
    while (pcVar3 = *ppcVar9, pcVar3 != (curl_slist *)0x0) {
      __s = pcVar3->data;
      pcVar7 = strchr(__s,0x3a);
      if (pcVar7 == (char *)0x0) {
        pcVar7 = strchr(__s,0x3b);
        if (pcVar7 != (char *)0x0) {
          n1len = (long)pcVar7 - (long)__s;
          do {
            do {
              do {
                pcVar7 = pcVar7 + 1;
                cVar1 = *pcVar7;
              } while (cVar1 == '\t');
            } while (cVar1 == ' ');
            if (cVar1 == '\0') goto LAB_00131512;
          } while ((byte)(cVar1 - 10U) < 4);
          if (cVar1 == '\0') {
LAB_00131512:
            pcVar7 = "";
            valuelen = 0;
            goto LAB_0013151c;
          }
        }
      }
      else {
        n1len = (long)pcVar7 - (long)__s;
        do {
          do {
            do {
              pcVar7 = pcVar7 + 1;
              cVar1 = *pcVar7;
            } while (cVar1 == '\t');
          } while (cVar1 == ' ');
          if (cVar1 == '\0') goto LAB_0013165c;
        } while ((byte)(cVar1 - 10U) < 4);
        if (cVar1 != '\0') {
          valuelen = strlen(pcVar7);
LAB_0013151c:
          if (((data->state).aptr.host == (char *)0x0) ||
             (_Var4 = hd_name_eq(__s,n1len,"Host:",5), !_Var4)) {
            uVar5 = (data->state).httpreq;
            if (uVar5 == '\x02') {
              _Var4 = hd_name_eq(__s,n1len,"Content-Type:",0xd);
              if (_Var4) goto LAB_0013165c;
              uVar5 = (data->state).httpreq;
            }
            if ((((uVar5 != '\x03') || (_Var4 = hd_name_eq(__s,n1len,"Content-Type:",0xd), !_Var4))
                && ((((data->req).field_0xdb & 4) == 0 ||
                    (_Var4 = hd_name_eq(__s,n1len,"Content-Length:",0xf), !_Var4)))) &&
               (((((data->state).aptr.te == (char *)0x0 ||
                  (_Var4 = hd_name_eq(__s,n1len,"Connection:",0xb), !_Var4)) &&
                 ((pcVar2->httpversion < 0x14 ||
                  (_Var4 = hd_name_eq(__s,n1len,"Transfer-Encoding:",0x12), !_Var4)))) &&
                ((((_Var4 = hd_name_eq(__s,n1len,"Authorization:",0xe), !_Var4 &&
                   (_Var4 = hd_name_eq(__s,n1len,"Cookie:",7), !_Var4)) ||
                  (_Var4 = Curl_auth_allowed_to_host(data), _Var4)) &&
                 (CVar6 = Curl_dynhds_add(hds,__s,n1len,pcVar7,valuelen), CVar6 != CURLE_OK)))))) {
              return CVar6;
            }
          }
        }
      }
LAB_0013165c:
      ppcVar9 = &pcVar3->next;
    }
    lVar8 = lVar8 + 1;
  } while( true );
}

Assistant:

CURLcode Curl_dynhds_add_custom(struct Curl_easy *data,
                                bool is_connect,
                                struct dynhds *hds)
{
  struct connectdata *conn = data->conn;
  char *ptr;
  struct curl_slist *h[2];
  struct curl_slist *headers;
  int numlists = 1; /* by default */
  int i;

#ifndef CURL_DISABLE_PROXY
  enum proxy_use proxy;

  if(is_connect)
    proxy = HEADER_CONNECT;
  else
    proxy = conn->bits.httpproxy && !conn->bits.tunnel_proxy ?
      HEADER_PROXY : HEADER_SERVER;

  switch(proxy) {
  case HEADER_SERVER:
    h[0] = data->set.headers;
    break;
  case HEADER_PROXY:
    h[0] = data->set.headers;
    if(data->set.sep_headers) {
      h[1] = data->set.proxyheaders;
      numlists++;
    }
    break;
  case HEADER_CONNECT:
    if(data->set.sep_headers)
      h[0] = data->set.proxyheaders;
    else
      h[0] = data->set.headers;
    break;
  }
#else
  (void)is_connect;
  h[0] = data->set.headers;
#endif

  /* loop through one or two lists */
  for(i = 0; i < numlists; i++) {
    for(headers = h[i]; headers; headers = headers->next) {
      const char *name, *value;
      size_t namelen, valuelen;

      /* There are 2 quirks in place for custom headers:
       * 1. setting only 'name:' to suppress a header from being sent
       * 2. setting only 'name;' to send an empty (illegal) header
       */
      ptr = strchr(headers->data, ':');
      if(ptr) {
        name = headers->data;
        namelen = ptr - headers->data;
        ptr++; /* pass the colon */
        while(*ptr && ISSPACE(*ptr))
          ptr++;
        if(*ptr) {
          value = ptr;
          valuelen = strlen(value);
        }
        else {
          /* quirk #1, suppress this header */
          continue;
        }
      }
      else {
        ptr = strchr(headers->data, ';');

        if(!ptr) {
          /* neither : nor ; in provided header value. We seem
           * to ignore this silently */
          continue;
        }

        name = headers->data;
        namelen = ptr - headers->data;
        ptr++; /* pass the semicolon */
        while(*ptr && ISSPACE(*ptr))
          ptr++;
        if(!*ptr) {
          /* quirk #2, send an empty header */
          value = "";
          valuelen = 0;
        }
        else {
          /* this may be used for something else in the future,
           * ignore this for now */
          continue;
        }
      }

      DEBUGASSERT(name && value);
      if(data->state.aptr.host &&
         /* a Host: header was sent already, do not pass on any custom Host:
            header as that will produce *two* in the same request! */
         hd_name_eq(name, namelen, STRCONST("Host:")))
        ;
      else if(data->state.httpreq == HTTPREQ_POST_FORM &&
              /* this header (extended by formdata.c) is sent later */
              hd_name_eq(name, namelen, STRCONST("Content-Type:")))
        ;
      else if(data->state.httpreq == HTTPREQ_POST_MIME &&
              /* this header is sent later */
              hd_name_eq(name, namelen, STRCONST("Content-Type:")))
        ;
      else if(data->req.authneg &&
              /* while doing auth neg, do not allow the custom length since
                 we will force length zero then */
              hd_name_eq(name, namelen, STRCONST("Content-Length:")))
        ;
      else if(data->state.aptr.te &&
              /* when asking for Transfer-Encoding, do not pass on a custom
                 Connection: */
              hd_name_eq(name, namelen, STRCONST("Connection:")))
        ;
      else if((conn->httpversion >= 20) &&
              hd_name_eq(name, namelen, STRCONST("Transfer-Encoding:")))
        /* HTTP/2 does not support chunked requests */
        ;
      else if((hd_name_eq(name, namelen, STRCONST("Authorization:")) ||
               hd_name_eq(name, namelen, STRCONST("Cookie:"))) &&
              /* be careful of sending this potentially sensitive header to
                 other hosts */
              !Curl_auth_allowed_to_host(data))
        ;
      else {
        CURLcode result;

        result = Curl_dynhds_add(hds, name, namelen, value, valuelen);
        if(result)
          return result;
      }
    }
  }

  return CURLE_OK;
}